

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinstats.cpp
# Opt level: O0

void kernel::ApplyCoinHash(MuHash3072 *muhash,COutPoint *outpoint,Coin *coin)

{
  long lVar1;
  MuHash3072 *this;
  long in_FS_OFFSET;
  Span<unsigned_char> SVar2;
  DataStream ss;
  COutPoint *in_stack_ffffffffffffff68;
  DataStream *in_stack_ffffffffffffff70;
  DataStream *in_stack_ffffffffffffff78;
  Span<const_unsigned_char> in_stack_ffffffffffffff90;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  DataStream::DataStream((DataStream *)in_stack_ffffffffffffff68);
  TxOutSer<DataStream>(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,(Coin *)0x943cfe);
  SVar2 = MakeUCharSpan<DataStream&>(in_stack_ffffffffffffff78);
  this = (MuHash3072 *)SVar2.m_size;
  Span<const_unsigned_char>::Span<unsigned_char,_0>
            ((Span<const_unsigned_char> *)in_stack_ffffffffffffff68,(Span<unsigned_char> *)0x943d43)
  ;
  MuHash3072::Insert(this,in_stack_ffffffffffffff90);
  DataStream::~DataStream((DataStream *)in_stack_ffffffffffffff68);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ApplyCoinHash(MuHash3072& muhash, const COutPoint& outpoint, const Coin& coin)
{
    DataStream ss{};
    TxOutSer(ss, outpoint, coin);
    muhash.Insert(MakeUCharSpan(ss));
}